

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void av1_set_cost_upd_freq
               (AV1_COMP *cpi,ThreadData_conflict *td,TileInfo *tile_info,int mi_row,int mi_col)

{
  AV1_COMMON *cm_00;
  uint8_t uVar1;
  INTERNAL_COST_UPDATE_TYPE IVar2;
  SequenceHeader *seq_params;
  int iVar3;
  AV1_COMMON *cm;
  
  seq_params = (cpi->common).seq_params;
  uVar1 = seq_params->monochrome;
  if ((cpi->common).features.disable_cdf_update == false) {
    IVar2 = (cpi->sf).inter_sf.coeff_cost_upd_level;
    if (IVar2 - INTERNAL_COST_UPD_SBROW_SET < 3) {
      iVar3 = skip_cost_update(seq_params,tile_info,mi_row,mi_col,IVar2);
      if (iVar3 == 0) {
        av1_fill_coeff_costs
                  (&(td->mb).coeff_costs,(td->mb).e_mbd.tile_ctx,(uint)(uVar1 == '\0') * 2 + 1);
      }
    }
    cm_00 = &cpi->common;
    IVar2 = (cpi->sf).inter_sf.mode_cost_upd_level;
    if (IVar2 - INTERNAL_COST_UPD_SBROW_SET < 3) {
      iVar3 = skip_cost_update((cpi->common).seq_params,tile_info,mi_row,mi_col,IVar2);
      if (iVar3 == 0) {
        av1_fill_mode_rates(cm_00,&(td->mb).mode_costs,(td->mb).e_mbd.tile_ctx);
      }
    }
    IVar2 = (cpi->sf).inter_sf.mv_cost_upd_level;
    if ((IVar2 - INTERNAL_COST_UPD_SBROW_SET < 3) &&
       (((cm_00->current_frame).frame_type & 0xfd) != 0)) {
      iVar3 = skip_cost_update((cpi->common).seq_params,tile_info,mi_row,mi_col,IVar2);
      if (iVar3 == 0) {
        av1_fill_mv_costs(&((td->mb).e_mbd.tile_ctx)->nmvc,
                          (uint)(cpi->common).features.cur_frame_force_integer_mv,
                          (uint)(cpi->common).features.allow_high_precision_mv,(td->mb).mv_costs);
      }
    }
    IVar2 = (cpi->sf).intra_sf.dv_cost_upd_level;
    if ((((IVar2 - INTERNAL_COST_UPD_SBROW_SET < 3) &&
         (((cm_00->current_frame).frame_type & 0xfd) == 0)) &&
        ((cpi->common).features.allow_screen_content_tools == true)) &&
       ((((cpi->common).features.allow_intrabc != false && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS))
        && (cpi->compressor_stage != '\x01')))) {
      iVar3 = skip_cost_update((cpi->common).seq_params,tile_info,mi_row,mi_col,IVar2);
      if (iVar3 == 0) {
        av1_fill_dv_costs(&((td->mb).e_mbd.tile_ctx)->ndvc,(td->mb).dv_costs);
        return;
      }
    }
  }
  return;
}

Assistant:

void av1_set_cost_upd_freq(AV1_COMP *cpi, ThreadData *td,
                           const TileInfo *const tile_info, const int mi_row,
                           const int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;

  if (cm->features.disable_cdf_update) {
    return;
  }

  switch (cpi->sf.inter_sf.coeff_cost_upd_level) {
    case INTERNAL_COST_UPD_OFF:
    case INTERNAL_COST_UPD_TILE:  // Tile level
      break;
    case INTERNAL_COST_UPD_SBROW_SET:  // SB row set level in tile
    case INTERNAL_COST_UPD_SBROW:      // SB row level in tile
    case INTERNAL_COST_UPD_SB:         // SB level
      if (skip_cost_update(cm->seq_params, tile_info, mi_row, mi_col,
                           cpi->sf.inter_sf.coeff_cost_upd_level))
        break;
      av1_fill_coeff_costs(&x->coeff_costs, xd->tile_ctx, num_planes);
      break;
    default: assert(0);
  }

  switch (cpi->sf.inter_sf.mode_cost_upd_level) {
    case INTERNAL_COST_UPD_OFF:
    case INTERNAL_COST_UPD_TILE:  // Tile level
      break;
    case INTERNAL_COST_UPD_SBROW_SET:  // SB row set level in tile
    case INTERNAL_COST_UPD_SBROW:      // SB row level in tile
    case INTERNAL_COST_UPD_SB:         // SB level
      if (skip_cost_update(cm->seq_params, tile_info, mi_row, mi_col,
                           cpi->sf.inter_sf.mode_cost_upd_level))
        break;
      av1_fill_mode_rates(cm, &x->mode_costs, xd->tile_ctx);
      break;
    default: assert(0);
  }

  switch (cpi->sf.inter_sf.mv_cost_upd_level) {
    case INTERNAL_COST_UPD_OFF:
    case INTERNAL_COST_UPD_TILE:  // Tile level
      break;
    case INTERNAL_COST_UPD_SBROW_SET:  // SB row set level in tile
    case INTERNAL_COST_UPD_SBROW:      // SB row level in tile
    case INTERNAL_COST_UPD_SB:         // SB level
      // Checks for skip status of mv cost update.
      if (skip_mv_cost_update(cpi, tile_info, mi_row, mi_col)) break;
      av1_fill_mv_costs(&xd->tile_ctx->nmvc,
                        cm->features.cur_frame_force_integer_mv,
                        cm->features.allow_high_precision_mv, x->mv_costs);
      break;
    default: assert(0);
  }

  switch (cpi->sf.intra_sf.dv_cost_upd_level) {
    case INTERNAL_COST_UPD_OFF:
    case INTERNAL_COST_UPD_TILE:  // Tile level
      break;
    case INTERNAL_COST_UPD_SBROW_SET:  // SB row set level in tile
    case INTERNAL_COST_UPD_SBROW:      // SB row level in tile
    case INTERNAL_COST_UPD_SB:         // SB level
      // Checks for skip status of dv cost update.
      if (skip_dv_cost_update(cpi, tile_info, mi_row, mi_col)) break;
      av1_fill_dv_costs(&xd->tile_ctx->ndvc, x->dv_costs);
      break;
    default: assert(0);
  }
}